

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O0

EntryType * __thiscall
SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
::AddInternal(SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
              *this,void *key,PinRecord data,uint targetBucket)

{
  bool bVar1;
  uint newSize;
  EntryType *pEVar2;
  EntryType *local_48;
  EntryType *current;
  uint depth;
  EntryType *entry;
  uint targetBucket_local;
  void *key_local;
  SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
  *this_local;
  PinRecord data_local;
  
  entry._4_4_ = targetBucket;
  if (((this->disableResize & 1U) == 0) &&
     (bVar1 = SimpleHashTable<void*,Memory::Recycler::PinRecord,Memory::HeapAllocator,DefaultComparer,true,PrimePolicy>
              ::IsDenserThan<6u>((SimpleHashTable<void*,Memory::Recycler::PinRecord,Memory::HeapAllocator,DefaultComparer,true,PrimePolicy>
                                  *)this), bVar1)) {
    newSize = PrimePolicy::GetSize(this->size << 1,&this->modFunctionIndex);
    Resize(this,newSize);
    entry._4_4_ = HashKeyToBucket(this,key);
  }
  pEVar2 = GetFreeEntry(this);
  pEVar2->key = key;
  (pEVar2->value).stackBackTraces = data.stackBackTraces;
  (pEVar2->value).refCount = data.refCount;
  pEVar2->next = this->table[entry._4_4_];
  this->table[entry._4_4_] = pEVar2;
  this->count = this->count + 1;
  current._4_4_ = 0;
  for (local_48 = this->table[entry._4_4_]; local_48 != (EntryType *)0x0; local_48 = local_48->next)
  {
    current._4_4_ = current._4_4_ + 1;
  }
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Insert(this->stats,current._4_4_);
  }
  return pEVar2;
}

Assistant:

EntryType* AddInternal(TKey key, TData data, uint targetBucket)
    {
        if(resize && !disableResize && IsDenserThan<MaxAverageChainLength>())
        {
            Resize(SizePolicy::GetSize(size*2, &modFunctionIndex));
            // After resize - we will need to recalculate the bucket
            targetBucket = HashKeyToBucket(key);
        }

        EntryType* entry = GetFreeEntry();
        entry->key = key;
        entry->value = data;
        entry->next = table[targetBucket];
        table[targetBucket] = entry;
        count++;

#if PROFILE_DICTIONARY
        uint depth = 0;
        for (EntryType * current = table[targetBucket] ; current != nullptr; current = current->next)
        {
            ++depth;
        }
        if (stats)
            stats->Insert(depth);
#endif
        return entry;
    }